

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_ps * stb_ps_remove(stb_ps *ps,void *value)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined8 *puVar4;
  int *piVar5;
  ulong uVar6;
  stb_ps_hash *psVar7;
  ulong uVar8;
  stb_ps *psVar9;
  int iVar10;
  stb_ps *psVar11;
  stb_ps *psVar12;
  long lVar13;
  stb_ps *psVar14;
  int iVar15;
  
  if (((ulong)value & 3) != 0) {
    __assert_fail("(3 & (int) value) == STB_ps_direct",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x1e7a,"stb_ps *stb_ps_remove(stb_ps *, void *)");
  }
  if (value != (void *)0x0) {
    switch((uint)ps & 3) {
    case 0:
      if (ps == (stb_ps *)value) {
        ps = (stb_ps *)0x0;
      }
      break;
    case 1:
      psVar14 = *(stb_ps **)(ps + -1);
      if (psVar14 == (stb_ps *)value) {
        *(undefined8 *)(ps + -1) = 0;
        psVar14 = (stb_ps *)0x0;
        uVar3 = 0;
      }
      else {
        uVar3 = (uint)(psVar14 != (stb_ps *)0x0);
      }
      psVar9 = *(stb_ps **)(ps + 7);
      if (psVar9 == (stb_ps *)value) {
        *(undefined8 *)(ps + 7) = 0;
        psVar9 = (stb_ps *)0x0;
      }
      else {
        uVar3 = (uVar3 + 1) - (uint)(psVar9 == (stb_ps *)0x0);
      }
      psVar11 = *(stb_ps **)(ps + 0xf);
      if (psVar11 == (stb_ps *)value) {
        *(undefined8 *)(ps + 0xf) = 0;
        psVar11 = (stb_ps *)0x0;
      }
      else {
        uVar3 = (uVar3 + 1) - (uint)(psVar11 == (stb_ps *)0x0);
      }
      psVar12 = *(stb_ps **)(ps + 0x17);
      if (psVar12 == (stb_ps *)value) {
        *(undefined8 *)(ps + 0x17) = 0;
        psVar12 = (stb_ps *)0x0;
      }
      else {
        uVar3 = (uVar3 + 1) - (uint)(psVar12 == (stb_ps *)0x0);
      }
      if (uVar3 == 1) {
        if ((((psVar14 == (stb_ps *)0x0) && (psVar14 = psVar9, psVar9 == (stb_ps *)0x0)) &&
            (psVar14 = psVar11, psVar11 == (stb_ps *)0x0)) &&
           (psVar14 = psVar12, psVar12 == (stb_ps *)0x0)) {
          __assert_fail("value != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1e8c,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        free(ps + -1);
        ps = psVar14;
      }
      break;
    case 2:
      uVar3 = *(uint *)(ps + -2);
      uVar8 = 0;
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar8 = (ulong)uVar3;
      }
      do {
        if (uVar8 == uVar6) {
          return ps;
        }
        uVar1 = uVar6 + 1;
        lVar13 = uVar6 * 8;
        uVar6 = uVar1;
      } while (*(void **)(ps + lVar13 + 6) != value);
      *(uint *)(ps + -2) = uVar3 - 1;
      *(undefined8 *)(ps + uVar1 * 8 + -2) = *(undefined8 *)(ps + (long)(int)uVar3 * 8 + -2);
      if (uVar3 - 1 == 3) {
        puVar4 = (undefined8 *)malloc(0x20);
        uVar2 = *(undefined8 *)(ps + 0xe);
        *puVar4 = *(undefined8 *)(ps + 6);
        puVar4[1] = uVar2;
        puVar4[2] = *(undefined8 *)(ps + 0x16);
        puVar4[3] = 0;
        free(ps + -2);
        ps = (stb_ps *)((long)puVar4 + 1);
      }
      break;
    case 3:
      uVar3 = stb_hashptr(value);
      uVar6 = (ulong)(*(uint *)(ps + 1) & uVar3);
      psVar14 = ps + 0x1d;
      if (*(void **)(ps + uVar6 * 8 + 0x1d) != value) {
        do {
          uVar6 = (ulong)((int)uVar6 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) &
                         *(uint *)(ps + 1));
        } while (*(void **)(psVar14 + uVar6 * 8) != value);
      }
      psVar9 = ps + -3;
      *(undefined8 *)(ps + uVar6 * 8 + 0x1d) = 1;
      uVar2 = *(undefined8 *)(ps + 5);
      iVar10 = (int)uVar2;
      iVar15 = iVar10 + -1;
      *(int *)(ps + 5) = iVar15;
      *(int *)(ps + 9) = (int)((ulong)uVar2 >> 0x20) + 1;
      if (iVar10 < 9) {
        piVar5 = (int *)malloc(0x48);
        uVar8 = 0;
        uVar6 = (ulong)*(uint *)psVar9;
        if ((int)*(uint *)psVar9 < 1) {
          uVar6 = uVar8;
        }
        iVar10 = 0;
        for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          if ((*(ulong *)(psVar14 + uVar8 * 8) & 0xfffffffe) != 0) {
            lVar13 = (long)iVar10;
            iVar10 = iVar10 + 1;
            *(ulong *)(piVar5 + lVar13 * 2 + 2) = *(ulong *)(psVar14 + uVar8 * 8);
          }
        }
        if (iVar10 != iVar15) {
          __assert_fail("j == h->count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1eb9,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        *piVar5 = iVar15;
        free(psVar9);
        ps = (stb_ps *)((long)piVar5 + 2);
      }
      else if (iVar15 == *(int *)(ps + 0x11)) {
        psVar7 = stb_ps_makehash((int)*(uint *)psVar9 >> 1,*(uint *)psVar9,(void **)psVar14);
        free(psVar9);
        ps = (stb_ps *)((long)&psVar7->size + 3);
      }
    }
  }
  return ps;
}

Assistant:

stb_ps *stb_ps_remove(stb_ps *ps, void *value)
{
   #ifdef STB_DEBUG
   assert(stb_ps_find(ps, value));
   #endif
   assert((3 & (int) value) == STB_ps_direct);
   if (value == NULL) return ps; // ignore NULL removes to avoid bad breakage
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps == value ? NULL : ps;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         int count=0;
         assert(STB_BUCKET_SIZE == 4);
         if (b->p[0] == value) b->p[0] = NULL; else count += (b->p[0] != NULL);
         if (b->p[1] == value) b->p[1] = NULL; else count += (b->p[1] != NULL);
         if (b->p[2] == value) b->p[2] = NULL; else count += (b->p[2] != NULL);
         if (b->p[3] == value) b->p[3] = NULL; else count += (b->p[3] != NULL);
         if (count == 1) { // shrink bucket at size 1
            value = b->p[0];
            if (value == NULL) value = b->p[1];
            if (value == NULL) value = b->p[2];
            if (value == NULL) value = b->p[3];
            assert(value != NULL);
            stb_bucket_free(b);
            return (stb_ps *) value; // return STB_ps_direct of value
         }
         return ps;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         int i;
         for (i=0; i < a->count; ++i) {
            if (a->p[i] == value) {
               a->p[i] = a->p[--a->count];
               if (a->count == 3) { // shrink to bucket!
                  stb_ps_bucket *b = stb_bucket_create3(a->p);
                  free(a);
                  return EncodeBucket(b);
               }
               return ps;
            }
         }
         return ps;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         stb_uint32 hash = stb_hashptr(value);
         stb_uint32 s, n = hash & h->mask;
         void **t = h->table;
         if (t[n] != value) {
            s = stb_rehash(hash) | 1;
            do {
               n = (n + s) & h->mask;
            } while (t[n] != value);
         }
         t[n] = STB_DEL;
         -- h->count;
         ++ h->count_deletes;
         // should we shrink down to an array?
         if (h->count < stb_ps_array_max) {
            int n = 1 << stb_log2_floor(stb_ps_array_max);
            if (h->count < n) {
               stb_ps_array *a = (stb_ps_array *) malloc(sizeof(*a) + (n-1) * sizeof(a->p[0]));
               int i,j=0;
               for (i=0; i < h->size; ++i)
                  if (!stb_ps_empty(t[i]))
                     a->p[j++] = t[i];
               assert(j == h->count);
               a->count = j;
               free(h);
               return EncodeArray(a);
            }
         }
         if (h->count == h->shrink_threshhold) {
            stb_ps_hash *h2 = stb_ps_makehash(h->size >> 1, h->size, t);
            free(h);
            return EncodeHash(h2);
         }
         return ps;
      }
   }
   return ps; /* NOTREACHED */
}